

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free_list.h
# Opt level: O3

void __thiscall re2c::free_list<re2c::RangeSuffix_*>::clear(free_list<re2c::RangeSuffix_*> *this)

{
  _Rb_tree_node_base *p_Var1;
  
  this->in_clear = true;
  for (p_Var1 = (this->
                super_set<re2c::RangeSuffix_*,_std::less<re2c::RangeSuffix_*>,_std::allocator<re2c::RangeSuffix_*>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->
       super_set<re2c::RangeSuffix_*,_std::less<re2c::RangeSuffix_*>,_std::allocator<re2c::RangeSuffix_*>_>
       )._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    operator_delete(*(void **)(p_Var1 + 1),0x18);
  }
  std::
  _Rb_tree<re2c::RangeSuffix_*,_re2c::RangeSuffix_*,_std::_Identity<re2c::RangeSuffix_*>,_std::less<re2c::RangeSuffix_*>,_std::allocator<re2c::RangeSuffix_*>_>
  ::clear((_Rb_tree<re2c::RangeSuffix_*,_re2c::RangeSuffix_*,_std::_Identity<re2c::RangeSuffix_*>,_std::less<re2c::RangeSuffix_*>,_std::allocator<re2c::RangeSuffix_*>_>
           *)this);
  this->in_clear = false;
  return;
}

Assistant:

void clear()
	{
		in_clear = true;

		for(iterator it = this->begin(); it != this->end(); ++it)
		{
			delete *it;
		}
		std::set<_Ty>::clear();
		
		in_clear = false;
	}